

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int ngram_model_free(ngram_model_t *model)

{
  ngram_class_s *pnVar1;
  int iVar2;
  int local_2c;
  int32 j;
  ngram_class_t *lmclass;
  int i;
  ngram_model_t *model_local;
  
  if (model == (ngram_model_t *)0x0) {
    model_local._4_4_ = 0;
  }
  else {
    iVar2 = model->refcount + -1;
    model->refcount = iVar2;
    if (iVar2 < 1) {
      if ((model->funcs != (ngram_funcs_s *)0x0) &&
         (model->funcs->free != (_func_void_ngram_model_t_ptr *)0x0)) {
        (*model->funcs->free)(model);
      }
      if (model->writable == '\0') {
        for (lmclass._4_4_ = 0; lmclass._4_4_ < (int)(uint)model->n_classes;
            lmclass._4_4_ = lmclass._4_4_ + 1) {
          pnVar1 = model->classes[lmclass._4_4_];
          for (local_2c = 0; local_2c < pnVar1->n_words; local_2c = local_2c + 1) {
            ckd_free(model->word_str[pnVar1->start_wid + local_2c]);
          }
          for (local_2c = 0; local_2c < pnVar1->n_hash; local_2c = local_2c + 1) {
            if (pnVar1->nword_hash[local_2c].wid != -1) {
              ckd_free(model->word_str[pnVar1->nword_hash[local_2c].wid]);
            }
          }
        }
      }
      else {
        for (lmclass._4_4_ = 0; lmclass._4_4_ < model->n_words; lmclass._4_4_ = lmclass._4_4_ + 1) {
          ckd_free(model->word_str[lmclass._4_4_]);
        }
      }
      for (lmclass._4_4_ = 0; lmclass._4_4_ < (int)(uint)model->n_classes;
          lmclass._4_4_ = lmclass._4_4_ + 1) {
        ngram_class_free(model->classes[lmclass._4_4_]);
      }
      ckd_free(model->classes);
      hash_table_free(model->wid);
      ckd_free(model->word_str);
      ckd_free(model->n_counts);
      ckd_free(model);
      model_local._4_4_ = 0;
    }
    else {
      model_local._4_4_ = model->refcount;
    }
  }
  return model_local._4_4_;
}

Assistant:

int
ngram_model_free(ngram_model_t * model)
{
    int i;

    if (model == NULL)
        return 0;
    if (--model->refcount > 0)
        return model->refcount;
    if (model->funcs && model->funcs->free)
        (*model->funcs->free) (model);
    if (model->writable) {
        /* Free all words. */
        for (i = 0; i < model->n_words; ++i) {
            ckd_free(model->word_str[i]);
        }
    }
    else {
        /* Free all class words. */
        for (i = 0; i < model->n_classes; ++i) {
            ngram_class_t *lmclass;
            int32 j;

            lmclass = model->classes[i];
            for (j = 0; j < lmclass->n_words; ++j) {
                ckd_free(model->word_str[lmclass->start_wid + j]);
            }
            for (j = 0; j < lmclass->n_hash; ++j) {
                if (lmclass->nword_hash[j].wid != -1) {
                    ckd_free(model->word_str[lmclass->nword_hash[j].wid]);
                }
            }
        }
    }
    for (i = 0; i < model->n_classes; ++i) {
        ngram_class_free(model->classes[i]);
    }
    ckd_free(model->classes);
    hash_table_free(model->wid);
    ckd_free(model->word_str);
    ckd_free(model->n_counts);
    ckd_free(model);
    return 0;
}